

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O2

json_t * get_root_option_json_object(char *json_string)

{
  json_t *json;
  json_error_t error;
  
  json = json_loads(json_string,0,&error);
  if (json == (json_t *)0x0) {
    json = (json_t *)0x0;
    fprintf(_stderr,"json error in options: on line %d: %s\n",(ulong)(uint)error.line);
  }
  else if (json->type != JSON_OBJECT) {
    fwrite("json error in options: root is not an object\n",0x2d,1,_stderr);
    json_decref(json);
    json = (json_t *)0x0;
  }
  return json;
}

Assistant:

json_t * get_root_option_json_object(const char * json_string)
{
	json_t * root;
	json_error_t error;

	root = json_loads(json_string, 0, &error);
	if (!root)
	{
		fprintf(stderr, "json error in options: on line %d: %s\n", error.line, error.text);
		return NULL;
	}

	if (!json_is_object(root))
	{
		fprintf(stderr, "json error in options: root is not an object\n");
		json_decref(root);
		return NULL;
	}

	return root;
}